

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slots.cpp
# Opt level: O2

void __thiscall MainWindow::showHistory(MainWindow *this)

{
  PersistantDialog *pPVar1;
  QVBoxLayout *this_00;
  QUndoView *this_01;
  QUndoGroup *pQVar2;
  QArrayDataPointer<char16_t> local_30;
  
  if (this->mHistoryDialog == (PersistantDialog *)0x0) {
    pPVar1 = (PersistantDialog *)operator_new(0x30);
    PersistantDialog::PersistantDialog(pPVar1,(QWidget *)this,(WindowFlags)0x8003000);
    this->mHistoryDialog = pPVar1;
    this_00 = (QVBoxLayout *)operator_new(0x20);
    QVBoxLayout::QVBoxLayout(this_00);
    this_01 = (QUndoView *)operator_new(0x28);
    pQVar2 = Module::undoGroup(this->mModule);
    QUndoView::QUndoView(this_01,pQVar2,(QWidget *)0x0);
    QBoxLayout::addWidget(this_00,this_01,0,0);
    QWidget::setLayout((QLayout *)this->mHistoryDialog);
    pPVar1 = this->mHistoryDialog;
    tr((QString *)&local_30,"History",(char *)0x0,-1);
    QWidget::setWindowTitle((QString *)pPVar1);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_30);
  }
  QWidget::show();
  return;
}

Assistant:

void MainWindow::showHistory() {
    if (mHistoryDialog == nullptr) {
        mHistoryDialog = new PersistantDialog(this, Qt::WindowTitleHint | Qt::WindowSystemMenuHint | Qt::WindowCloseButtonHint);
        auto layout = new QVBoxLayout;
        auto undoView = new QUndoView(mModule->undoGroup());
        layout->addWidget(undoView);
        mHistoryDialog->setLayout(layout);
        mHistoryDialog->setWindowTitle(tr("History"));
    } 
    mHistoryDialog->show();
    
}